

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O3

void __thiscall thread_pool::ThreadPool::~ThreadPool(ThreadPool *this)

{
  pointer pTVar1;
  pointer ptVar2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  thread *it;
  pointer this_00;
  pointer ptVar3;
  
  pTVar1 = (this->queues_).
           super__Vector_base<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->queues_).
                 super__Vector_base<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pTVar1; this_00 = this_00 + 1
      ) {
    TaskQueue::Done(this_00);
  }
  ptVar2 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar3 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar3 != ptVar2; ptVar3 = ptVar3 + 1) {
    std::thread::join();
  }
  std::
  vector<thread_pool::ThreadPool::TaskQueue,_std::allocator<thread_pool::ThreadPool::TaskQueue>_>::
  ~vector(&this->queues_);
  std::
  _Hashtable<std::thread::id,_std::pair<const_std::thread::id,_unsigned_long>,_std::allocator<std::pair<const_std::thread::id,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::thread::id>,_std::hash<std::thread::id>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->thread_map_)._M_h);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  return;
}

Assistant:

~ThreadPool() {
    for (auto& it : queues_) {
      it.Done();
    }
    for (auto& it : threads_) {
      it.join();
    }
  }